

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  float fVar14;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  nk_flags ws;
  nk_flags local_54;
  float local_50;
  float local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_54 = 0;
  uVar12 = *state & 2 | 4;
  *state = uVar12;
  if (in == (nk_input *)0x0) {
    return scroll_offset;
  }
  iVar11 = (in->mouse).buttons[0].down;
  uVar2 = cursor->x;
  uVar6 = cursor->y;
  uVar3 = cursor->w;
  uVar7 = cursor->h;
  fVar14 = (in->mouse).buttons[0].clicked_pos.x;
  bVar13 = true;
  if (((float)uVar2 <= fVar14) && (fVar14 < (float)uVar2 + (float)uVar3)) {
    fVar14 = (in->mouse).buttons[0].clicked_pos.y;
    bVar13 = iVar11 != 1 || ((float)uVar6 + (float)uVar7 <= fVar14 || fVar14 < (float)uVar6);
  }
  uVar10 = (in->mouse).buttons[0].clicked;
  uVar4 = scroll->x;
  uVar8 = scroll->y;
  uVar5 = scroll->w;
  uVar9 = scroll->h;
  fVar14 = (in->mouse).pos.x;
  if (((((float)uVar4 <= fVar14) && (fVar14 < (float)uVar4 + (float)uVar5)) &&
      (fVar14 = (in->mouse).pos.y, (float)uVar8 <= fVar14)) &&
     (fVar14 < (float)uVar8 + (float)uVar9)) {
    *state = 0x12;
    uVar12 = 0x12;
  }
  local_4c = (&((nk_vec2 *)((in->mouse).buttons + 5))[1].x)[o == NK_VERTICAL];
  if ((iVar11 == 0 || bVar13) || (uVar10 != 0)) {
    uVar10 = (in->keyboard).keys[0x1d].clicked;
    local_48 = (float)uVar9;
    if ((in->keyboard).keys[0x1d].down == 0) {
      if (1 < uVar10) goto LAB_00139d48;
LAB_00139d66:
      local_50 = scroll_step;
      fStack_44 = (float)uVar9;
      fStack_40 = (float)uVar9;
      fStack_3c = (float)uVar9;
      iVar11 = nk_button_behavior(&local_54,*empty0,in,NK_BUTTON_DEFAULT);
      if (iVar11 != 0) {
        if (o != NK_VERTICAL) {
          local_48 = scroll->w;
        }
        goto LAB_00139dc4;
      }
      uVar10 = (in->keyboard).keys[0x1c].clicked;
      if ((in->keyboard).keys[0x1c].down == 0) {
        bVar13 = 1 < uVar10;
      }
      else {
        bVar13 = uVar10 != 0;
      }
      if ((bool)(bVar13 & has_scrolling != 0 & o == NK_VERTICAL)) {
LAB_00139f08:
        fVar14 = scroll_offset + local_48;
        if (target - local_48 <= scroll_offset + local_48) {
          fVar14 = target - local_48;
        }
      }
      else {
        iVar11 = nk_button_behavior(&local_54,*empty1,in,NK_BUTTON_DEFAULT);
        if (iVar11 == 0) {
          fVar14 = scroll_offset;
          if (has_scrolling != 0) {
            if (local_4c == 0.0) {
              uVar10 = (in->keyboard).keys[0x1a].clicked;
              if ((in->keyboard).keys[0x1a].down == 0) {
                if (uVar10 < 2) goto LAB_0013a00c;
              }
              else if (uVar10 == 0) {
LAB_0013a00c:
                uVar10 = (in->keyboard).keys[0x1b].clicked;
                if ((in->keyboard).keys[0x1b].down == 0) {
                  if (1 < uVar10 && o == NK_VERTICAL) goto LAB_0013a046;
                }
                else if (o == NK_VERTICAL && uVar10 != 0) {
LAB_0013a046:
                  fVar16 = target - local_48;
                  goto LAB_0013a04a;
                }
                goto LAB_00139dcb;
              }
              if (o == NK_VERTICAL) {
                fVar14 = 0.0;
              }
            }
            else {
              fVar16 = scroll_offset - local_50 * local_4c;
              if (o != NK_VERTICAL) {
                local_48 = scroll->w;
              }
              if (target - local_48 <= fVar16) {
                fVar16 = target - local_48;
              }
              fVar14 = 0.0;
              if (0.0 <= fVar16) {
LAB_0013a04a:
                fVar14 = fVar16;
              }
            }
          }
        }
        else {
          if (o == NK_VERTICAL) goto LAB_00139f08;
          fVar14 = scroll_offset + scroll->w;
          fVar16 = target - scroll->w;
          if (fVar16 <= fVar14) {
            fVar14 = fVar16;
          }
        }
      }
    }
    else {
      if (uVar10 == 0) goto LAB_00139d66;
LAB_00139d48:
      if (has_scrolling == 0 || o != NK_VERTICAL) goto LAB_00139d66;
LAB_00139dc4:
      fVar14 = scroll_offset - local_48;
      if (scroll_offset - local_48 <= 0.0) {
        fVar14 = 0.0;
      }
    }
LAB_00139dcb:
    uVar18._0_4_ = scroll->x;
    uVar18._4_4_ = scroll->y;
    uVar15._0_4_ = scroll->w;
    uVar15._4_4_ = scroll->h;
    if ((uVar12 & 0x10) == 0) goto LAB_00139e88;
    fVar16 = (in->mouse).prev.x;
    if ((fVar16 < (float)(undefined4)uVar18) ||
       (fVar17 = (float)(undefined4)uVar18 + (float)(undefined4)uVar15, fVar17 <= fVar16)) {
LAB_00139e1e:
      uVar12 = uVar12 | 8;
      goto LAB_00139ec6;
    }
    fVar1 = (in->mouse).prev.y;
    if ((fVar1 < (float)uVar18._4_4_) || ((float)uVar18._4_4_ + (float)uVar15._4_4_ <= fVar1))
    goto LAB_00139e1e;
  }
  else {
    *state = 0x22;
    if (o == NK_VERTICAL) {
      fVar16 = ((in->mouse).delta.y / (float)uVar9) * target + scroll_offset;
      if (target - (float)uVar9 <= fVar16) {
        fVar16 = target - (float)uVar9;
      }
      fVar14 = 0.0;
      if (0.0 <= fVar16) {
        fVar14 = fVar16;
      }
      (in->mouse).buttons[0].clicked_pos.y =
           (float)uVar7 * 0.5 + (fVar14 / target) * (float)uVar9 + (float)uVar8;
    }
    else {
      fVar16 = scroll->w;
      fVar17 = ((in->mouse).delta.x / fVar16) * target + scroll_offset;
      if (target - fVar16 <= fVar17) {
        fVar17 = target - fVar16;
      }
      fVar14 = 0.0;
      if (0.0 <= fVar17) {
        fVar14 = fVar17;
      }
      (in->mouse).buttons[0].clicked_pos.x =
           cursor->w * 0.5 + (fVar14 / target) * fVar16 + scroll->x;
    }
    uVar18._0_4_ = scroll->x;
    uVar18._4_4_ = scroll->y;
    uVar15._0_4_ = scroll->w;
    uVar15._4_4_ = scroll->h;
    uVar12 = 0x22;
LAB_00139e88:
    fVar16 = (in->mouse).prev.x;
    fVar17 = (float)uVar18 + (float)uVar15;
  }
  if (fVar16 < (float)uVar18) {
    return fVar14;
  }
  if (fVar17 <= fVar16) {
    return fVar14;
  }
  fVar17 = (float)((ulong)uVar18 >> 0x20);
  fVar16 = (in->mouse).prev.y;
  if (fVar16 < fVar17) {
    return fVar14;
  }
  if (fVar17 + (float)((ulong)uVar15 >> 0x20) <= fVar16) {
    return fVar14;
  }
  uVar12 = uVar12 | 0x40;
LAB_00139ec6:
  *state = uVar12;
  return fVar14;
}

Assistant:

NK_LIB float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws = 0;
    int left_mouse_down;
    int left_mouse_clicked;
    int left_mouse_click_in_cursor;
    float scroll_delta;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_clicked = in->mouse.buttons[NK_BUTTON_LEFT].clicked;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    scroll_delta = (o == NK_VERTICAL) ? in->mouse.scroll_delta.y: in->mouse.scroll_delta.x;
    if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((scroll_delta < 0 || (scroll_delta > 0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}